

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

string * read_from_file_abi_cxx11_(string *__return_storage_ptr__,char *infile)

{
  byte bVar1;
  ostream *poVar2;
  streambuf_type *__s;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_251;
  undefined1 local_250 [12];
  undefined1 local_240 [2] [12];
  long local_220;
  ifstream instream;
  char *infile_local;
  
  std::ifstream::ifstream(&local_220,infile,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open file: ");
    poVar2 = std::operator<<(poVar2,infile);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  std::ios_base::unsetf((ios_base *)((long)&local_220 + *(long *)(local_220 + -0x18)),_S_skipws);
  __s = (streambuf_type *)std::ifstream::rdbuf();
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_240,__s);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_250);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_240[0]._0_8_;
  __beg._M_c = local_240[0]._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_250._0_8_;
  __end._M_c = local_250._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_251);
  std::allocator<char>::~allocator(&local_251);
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
read_from_file(char const* infile)
{
    std::ifstream instream(infile);
    if (!instream.is_open()) {
        std::cerr << "Couldn't open file: " << infile << std::endl;
        exit(-1);
    }
    instream.unsetf(std::ios::skipws);      // No white space skipping!
    return std::string(std::istreambuf_iterator<char>(instream.rdbuf()),
        std::istreambuf_iterator<char>());
}